

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int fits_execute_template(fitsfile *ff,char *ngp_template,int *status)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_100 [8];
  long luv;
  char used_name [80];
  char grnm [80];
  int local_4c;
  int local_48;
  int used_ver;
  int more_keys;
  int keys_exist;
  int tmp0;
  int my_hn;
  int i;
  int first_extension;
  int exit_flg;
  int r;
  int *status_local;
  char *ngp_template_local;
  fitsfile *ff_local;
  
  if (status == (int *)0x0) {
    ff_local._4_4_ = 0x16a;
  }
  else if (*status == 0) {
    if ((ff == (fitsfile *)0x0) || (ngp_template == (char *)0x0)) {
      *status = 0x16a;
      ff_local._4_4_ = *status;
    }
    else {
      ngp_inclevel = 0;
      ngp_grplevel = 0;
      master_grp_idx = 1;
      i = 0;
      ngp_master_dir[0] = '\0';
      my_hn = 1;
      _exit_flg = status;
      status_local = (int *)ngp_template;
      ngp_template_local = (char *)ff;
      first_extension = ngp_delete_extver_tab();
      if (first_extension == 0) {
        ffghdn((fitsfile *)ngp_template_local,&keys_exist);
        if (keys_exist < 2) {
          ffmahd((fitsfile *)ngp_template_local,1,&more_keys,_exit_flg);
          ffghsp((fitsfile *)ngp_template_local,&used_ver,&local_48,_exit_flg);
          ffmahd((fitsfile *)ngp_template_local,keys_exist,&more_keys,_exit_flg);
          if (*_exit_flg != 0) {
            return *_exit_flg;
          }
          if (0 < used_ver) {
            my_hn = 0;
          }
        }
        else {
          my_hn = 0;
          for (tmp0 = 2; tmp0 <= keys_exist; tmp0 = tmp0 + 1) {
            *_exit_flg = 0;
            ffmahd((fitsfile *)ngp_template_local,1,&more_keys,_exit_flg);
            if (*_exit_flg != 0) break;
            ffgky((fitsfile *)ngp_template_local,0x10,"EXTNAME",&luv,(char *)0x0,_exit_flg);
            if (*_exit_flg == 0) {
              ffgky((fitsfile *)ngp_template_local,0x29,"EXTVER",local_100,(char *)0x0,_exit_flg);
              local_4c = local_100._0_4_;
              if (*_exit_flg == 0xcc) {
                local_4c = 1;
                *_exit_flg = 0;
              }
              if (*_exit_flg == 0) {
                iVar1 = ngp_set_extver((char *)&luv,local_4c);
                *_exit_flg = iVar1;
              }
            }
          }
          ffmahd((fitsfile *)ngp_template_local,keys_exist,&more_keys,_exit_flg);
        }
        if (*_exit_flg == 0) {
          iVar1 = ngp_include_file((char *)status_local);
          *_exit_flg = iVar1;
          if (iVar1 == 0) {
            sVar2 = strlen((char *)status_local);
            tmp0 = (int)sVar2;
            do {
              iVar1 = tmp0;
              tmp0 = iVar1 + -1;
              if (tmp0 < 0) break;
            } while (*(char *)((long)status_local + (long)tmp0) != '/');
            tmp0 = iVar1;
            if (999 < iVar1) {
              tmp0 = 999;
            }
            if (0 < tmp0) {
              memcpy(ngp_master_dir,status_local,(long)tmp0);
              ngp_master_dir[tmp0] = '\0';
            }
            first_extension = ngp_read_line(1);
            if (first_extension == 0) {
              if (ngp_keyidx - 1U < 4 || ngp_keyidx == 5) {
                iVar1 = (*(code *)(&DAT_0029aa50 +
                                  *(int *)(&DAT_0029aa50 + (ulong)(ngp_keyidx - 1U) * 4)))();
                return iVar1;
              }
              first_extension = 0x171;
            }
            ngp_free_line();
            ngp_free_prevline();
            ngp_delete_extver_tab();
            *_exit_flg = first_extension;
            ff_local._4_4_ = first_extension;
          }
          else {
            ff_local._4_4_ = *_exit_flg;
          }
        }
        else {
          ff_local._4_4_ = *_exit_flg;
        }
      }
      else {
        *_exit_flg = first_extension;
        ff_local._4_4_ = first_extension;
      }
    }
  }
  else {
    ff_local._4_4_ = *status;
  }
  return ff_local._4_4_;
}

Assistant:

int	fits_execute_template(fitsfile *ff, char *ngp_template, int *status)
 { int		r, exit_flg, first_extension, i, my_hn, tmp0, keys_exist, more_keys, used_ver;
   char		grnm[NGP_MAX_STRING], used_name[NGP_MAX_STRING];
   long		luv;

   if (NULL == status) return(NGP_NUL_PTR);
   if (NGP_OK != *status) return(*status);

   /* This function uses many global variables (local to this file) and
      therefore is not thread-safe. */
   FFLOCK;
   
   if ((NULL == ff) || (NULL == ngp_template))
     { *status = NGP_NUL_PTR;
       FFUNLOCK;
       return(*status);
     }

   ngp_inclevel = 0;				/* initialize things, not all should be zero */
   ngp_grplevel = 0;
   master_grp_idx = 1;
   exit_flg = 0;
   ngp_master_dir[0] = 0;			/* this should be before 1st call to ngp_include_file */
   first_extension = 1;				/* we need to create PHDU */

   if (NGP_OK != (r = ngp_delete_extver_tab()))
     { *status = r;
       FFUNLOCK;
       return(r);
     }

   fits_get_hdu_num(ff, &my_hn);		/* our HDU position */
   if (my_hn <= 1)				/* check whether we really need to create PHDU */
     { fits_movabs_hdu(ff, 1, &tmp0, status);
       fits_get_hdrspace(ff, &keys_exist, &more_keys, status);
       fits_movabs_hdu(ff, my_hn, &tmp0, status);
       if (NGP_OK != *status) /* error here means file is corrupted */
       {
          FFUNLOCK;
          return(*status);	
       }
       if (keys_exist > 0) first_extension = 0;	/* if keywords exist assume PHDU already exist */
     }
   else
     { first_extension = 0;			/* PHDU (followed by 1+ extensions) exist */

       for (i = 2; i<= my_hn; i++)
        { *status = NGP_OK;
          fits_movabs_hdu(ff, 1, &tmp0, status);
          if (NGP_OK != *status) break;

          fits_read_key(ff, TSTRING, "EXTNAME", used_name, NULL, status);
          if (NGP_OK != *status)  continue;

          fits_read_key(ff, TLONG, "EXTVER", &luv, NULL, status);
          used_ver = luv;			/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
          if (VALUE_UNDEFINED == *status)
            { used_ver = 1;
              *status = NGP_OK;
            }

          if (NGP_OK == *status) *status = ngp_set_extver(used_name, used_ver);
        }

       fits_movabs_hdu(ff, my_hn, &tmp0, status);
     }
     
   if (NGP_OK != *status) {
      FFUNLOCK;
      return(*status);
   }                                                                       
   if (NGP_OK != (*status = ngp_include_file(ngp_template))) {
      FFUNLOCK;
      return(*status);
   }
   
   for (i = strlen(ngp_template) - 1; i >= 0; i--) /* strlen is > 0, otherwise fopen failed */
    { 
#ifdef MSDOS
      if ('\\' == ngp_template[i]) break;
#else
      if ('/' == ngp_template[i]) break;
#endif
    } 
      
   i++;
   if (i > (NGP_MAX_FNAME - 1)) i = NGP_MAX_FNAME - 1;

   if (i > 0)
     { memcpy(ngp_master_dir, ngp_template, i);
       ngp_master_dir[i] = 0;
     }


   for (;;)
    { if (NGP_OK != (r = ngp_read_line(1))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
         case NGP_TOKEN_SIMPLE:
			if (0 == first_extension)	/* simple only allowed in first HDU */
			  { r = NGP_TOKEN_NOT_EXPECT;
			    break;
			  }
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, NGP_XTENSION_SIMPLE | NGP_XTENSION_FIRST);
			first_extension = 0;
			break;

         case NGP_TOKEN_XTENSION:
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, (first_extension ? NGP_XTENSION_FIRST : 0));
			first_extension = 0;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING); }
			else
			  { snprintf(grnm,NGP_MAX_STRING, "DEFAULT_GROUP_%d", master_grp_idx++); }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, 0);
			first_extension = 0;
			break;

	 case NGP_TOKEN_EOF:
			exit_flg = 1;
			break;

         default:	r = NGP_TOKEN_NOT_EXPECT;
			break;
       }
      if (exit_flg || (NGP_OK != r)) break;
    }

/* all top level HDUs up to faulty one are left intact in case of i/o error. It is up
   to the caller to call fits_close_file or fits_delete_file when this function returns
   error. */

   ngp_free_line();		/* deallocate last line (if any) */
   ngp_free_prevline();		/* deallocate cached line (if any) */
   ngp_delete_extver_tab();	/* delete extver table (if present), error ignored */
   
   *status = r;
   FFUNLOCK;
   return(r);
 }